

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O3

ObjectPtr __thiscall
ICM::DefFunc::Convert::StringToNumber::func(StringToNumber *this,DataList *list)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  long in_RDX;
  Rational<long_long> RVar3;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string
            ((string *)&local_38,(char *)**(undefined8 **)(**(long **)(in_RDX + 8) + 8),&local_39);
  RVar3 = Common::Number::to_rational<long_long>(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  pp_Var1 = (_func_int **)operator_new(0x10);
  *pp_Var1 = (_func_int *)0x8;
  pp_Var1[1] = (_func_int *)0x0;
  p_Var2 = (_func_int *)operator_new(8);
  *(Type *)p_Var2 = RVar3._numerator;
  pp_Var1[1] = p_Var2;
  (this->super_FI)._vptr_FuncInitObject = pp_Var1;
  return (ObjectPtr)(Object *)this;
}

Assistant:

ObjectPtr func(const DataList &list) const {
					TypeBase::NumberType num = (TypeBase::NumberType)Common::Number::to_rational<long long>(list[0]->dat<T_String>().c_str()).num();
					return ObjectPtr(new Objects::Number(num));
				}